

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMLReaderImpl.h
# Opt level: O0

void __thiscall
irr::io::CXMLReaderImpl<char,_irr::io::IXMLBase>::convertTextData<unsigned_short>
          (CXMLReaderImpl<char,_irr::io::IXMLBase> *this,unsigned_short *source,char *pointerToStore
          ,int sizeWithoutHeader)

{
  bool bVar1;
  bool bVar2;
  char *pcVar3;
  int local_38;
  int i;
  unsigned_short cc;
  size_t numShift;
  int sizeWithoutHeader_local;
  char *pointerToStore_local;
  unsigned_short *source_local;
  CXMLReaderImpl<char,_irr::io::IXMLBase> *this_local;
  
  bVar1 = isLittleEndian(this,this->TargetFormat);
  bVar2 = isLittleEndian(this,this->SourceFormat);
  if (bVar1 != bVar2) {
    convertToLittleEndian<unsigned_short>(this,source);
  }
  pcVar3 = (char *)operator_new__((long)sizeWithoutHeader);
  this->TextData = pcVar3;
  for (local_38 = 0; local_38 < sizeWithoutHeader; local_38 = local_38 + 1) {
    this->TextData[local_38] = (char)source[local_38];
  }
  this->TextBegin = this->TextData;
  this->TextSize = sizeWithoutHeader;
  if (pointerToStore != (char *)0x0) {
    operator_delete__(pointerToStore);
  }
  return;
}

Assistant:

void convertTextData(src_char_type* source, char* pointerToStore, int sizeWithoutHeader)
	{
		// convert little to big endian if necessary
		if (sizeof(src_char_type) > 1 && 
			isLittleEndian(TargetFormat) != isLittleEndian(SourceFormat))
			convertToLittleEndian(source);

		// check if conversion is necessary:
		if (sizeof(src_char_type) == sizeof(char_type))
		{
			// no need to convert
			TextBegin = (char_type*)source;
			TextData = (char_type*)pointerToStore;
			TextSize = sizeWithoutHeader;
		}
		else
		{
			// convert source into target data format. 
			// TODO: implement a real conversion. This one just 
			// copies bytes. This is a problem when there are 
			// unicode symbols using more than one character.

			TextData = new char_type[sizeWithoutHeader];

			// MSVC debugger complains here about loss of data ...
			size_t numShift = sizeof( char_type) * 8;
			assert(numShift < 64);
			const src_char_type cc = (src_char_type)(((uint64_t(1u) << numShift) - 1));
			for (int i=0; i<sizeWithoutHeader; ++i)
				TextData[i] = char_type( source[i] & cc); 

			TextBegin = TextData;
			TextSize = sizeWithoutHeader;

			// delete original data because no longer needed
			delete [] pointerToStore;
		}
	}